

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O2

message<MsgType> * __thiscall
blcl::net::tsqueue<blcl::net::message<MsgType>_>::pop_front
          (message<MsgType> *__return_storage_ptr__,tsqueue<blcl::net::message<MsgType>_> *this)

{
  std::mutex::lock(&this->queue_mtx_);
  message<MsgType>::message
            (__return_storage_ptr__,
             (this->raw_deque_).
             super__Deque_base<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  std::deque<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>::pop_front
            (&this->raw_deque_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mtx_);
  return __return_storage_ptr__;
}

Assistant:

T pop_front() {
            std::scoped_lock lock(queue_mtx_);
            auto t = std::move(raw_deque_.front());
            raw_deque_.pop_front();
            return t;
        }